

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O2

void __thiscall
mjs::string_object::string_object
          (string_object *this,string *class_name,object_ptr *prototype,string *val,
          bool is_v5_or_later)

{
  native_object::native_object(&this->super_native_object,class_name,prototype);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_001d85b0;
  *(uint32_t *)&(this->super_native_object).field_0x24 =
       (val->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  this->is_v5_or_later_ = is_v5_or_later;
  native_object::add_native_property<mjs::string_object,_&mjs::string_object::get_length,_nullptr>
            (&this->super_native_object,"length",dont_delete|dont_enum|read_only);
  return;
}

Assistant:

explicit string_object(const string& class_name, const object_ptr& prototype, const string& val, bool is_v5_or_later)
        : native_object{class_name, prototype}
        , value_{val.unsafe_raw_get()}
        , is_v5_or_later_{is_v5_or_later} {
        DEFINE_NATIVE_PROPERTY_READONLY(string_object, length);
    }